

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave.c
# Opt level: O2

void cave_free(chunk_conflict *c)

{
  object *obj;
  _Bool _Var1;
  loc grid;
  square *psVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  chunk *p_c;
  ulong uVar6;
  
  if (player == (player *)0x0 || cave != c) {
    p_c = (chunk *)0x0;
  }
  else {
    p_c = (chunk *)player->cave;
  }
  cave_connectors_free(c->join);
  lVar3 = 8;
  for (uVar6 = 1; uVar6 < c->obj_max; uVar6 = uVar6 + 1) {
    lVar4 = *(long *)((long)c->objects + lVar3);
    if (lVar4 != 0) {
      _Var1 = loc_is_zero(*(loc_conflict *)(lVar4 + 0x34));
      if (_Var1) {
        object_delete((chunk *)c,p_c,(object **)((long)c->objects + lVar3));
      }
    }
    lVar3 = lVar3 + 8;
  }
  for (lVar3 = 0; lVar3 < c->height; lVar3 = lVar3 + 1) {
    lVar5 = 0;
    for (lVar4 = 0; lVar4 < c->width; lVar4 = lVar4 + 1) {
      mem_free(*(void **)((long)&c->squares[lVar3]->info + lVar5));
      psVar2 = c->squares[lVar3];
      if (*(long *)((long)&psVar2->trap + lVar5) != 0) {
        grid = (loc)loc((int)lVar4,(int)lVar3);
        square_free_trap((chunk *)c,grid);
        psVar2 = c->squares[lVar3];
      }
      obj = *(object **)((long)&psVar2->obj + lVar5);
      if (obj != (object *)0x0) {
        object_pile_free((chunk *)c,p_c,obj);
      }
      lVar5 = lVar5 + 0x28;
    }
    mem_free(c->squares[lVar3]);
  }
  mem_free(c->squares);
  heatmap_free(c,(heatmap)(c->noise).grids);
  heatmap_free(c,(heatmap)(c->scent).grids);
  mem_free(c->feat_count);
  mem_free(c->objects);
  mem_free(c->monsters);
  mem_free(c->monster_groups);
  if (c->ghost != (ghost_info *)0x0) {
    mem_free(c->ghost);
  }
  if (c->name != (char *)0x0) {
    string_free(c->name);
  }
  mem_free(c);
  return;
}

Assistant:

void cave_free(struct chunk *c) {
	struct chunk *p_c = (c == cave && player) ? player->cave : NULL;
	int y, x, i;

	cave_connectors_free(c->join);

	/* Look for orphaned objects and delete them. */
	for (i = 1; i < c->obj_max; i++) {
		if (c->objects[i] && loc_is_zero(c->objects[i]->grid)) {
			object_delete(c, p_c, &c->objects[i]);
		}
	}

	for (y = 0; y < c->height; y++) {
		for (x = 0; x < c->width; x++) {
			mem_free(c->squares[y][x].info);
			if (c->squares[y][x].trap)
				square_free_trap(c, loc(x, y));
			if (c->squares[y][x].obj)
				object_pile_free(c, p_c, c->squares[y][x].obj);
		}
		mem_free(c->squares[y]);
	}
	mem_free(c->squares);
	heatmap_free(c, c->noise);
	heatmap_free(c, c->scent);

	mem_free(c->feat_count);
	mem_free(c->objects);
	mem_free(c->monsters);
	mem_free(c->monster_groups);
	if (c->ghost) {
		mem_free(c->ghost);
	}
	if (c->name)
		string_free(c->name);
	mem_free(c);
}